

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildHeapBufferReload(IRBuilderAsmJs *this,uint32 offset,bool isFirstLoad)

{
  anon_class_24_3_9b9f9fea *paVar1;
  bool bVar2;
  bool bVar3;
  JITTimeFunctionBody *pJVar4;
  AsmJsJITInfo *this_00;
  int32 fieldOffset;
  ConstSlots src;
  ShouldReload shouldReload;
  undefined1 local_54 [8];
  uint32 offset_local;
  anon_class_24_3_9b9f9fea AddLoadField;
  bool isFirstLoad_local;
  
  AddLoadField.this = (IRBuilderAsmJs *)local_54;
  unique0x00004780 = (undefined1 *)((long)&AddLoadField.offset + 7);
  local_54._0_4_ = offset;
  AddLoadField.isFirstLoad = (bool *)this;
  AddLoadField.offset._7_1_ = isFirstLoad;
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(pJVar4);
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar4);
  bVar3 = AsmJsJITInfo::IsSharedMemory(this_00);
  if (bVar2) {
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              ((anon_class_24_3_9b9f9fea *)(local_54 + 4),WasmMemoryReg,ModuleMemReg,0,TyVar,
               DontReload);
    if (bVar3) {
      paVar1 = (anon_class_24_3_9b9f9fea *)(local_54 + 4);
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                (paVar1,ArrayReg,WasmMemoryReg,0x20,TyVar,DontReload);
      src = SharedContents;
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                (paVar1,SharedContents,ArrayReg,0x28,TyVar,DontReload);
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                (paVar1,BufferReg,SharedContents,0,TyVar,DontReload);
      fieldOffset = 0x10;
    }
    else {
      paVar1 = (anon_class_24_3_9b9f9fea *)(local_54 + 4);
      src = ArrayReg;
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                (paVar1,ArrayReg,WasmMemoryReg,0x20,TyVar,DoReload);
      pJVar4 = Func::GetJITFunctionBody(this->m_func);
      bVar2 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(pJVar4);
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                (paVar1,RefCountedBuffer,ArrayReg,0x38,TyVar,DoReload);
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                (paVar1,BufferReg,RefCountedBuffer,0,TyVar,(uint)bVar2);
      fieldOffset = 0x40;
    }
    shouldReload = DoReload;
  }
  else {
    paVar1 = (anon_class_24_3_9b9f9fea *)(local_54 + 4);
    src = ArrayReg;
    shouldReload = DontReload;
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              (paVar1,ArrayReg,ModuleMemReg,0,TyVar,DontReload);
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              (paVar1,RefCountedBuffer,ArrayReg,0x38,TyVar,DontReload);
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              (paVar1,BufferReg,RefCountedBuffer,0,TyVar,DontReload);
    fieldOffset = 0x40;
  }
  BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
            ((anon_class_24_3_9b9f9fea *)(local_54 + 4),LengthReg,src,fieldOffset,TyUint32,
             shouldReload);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildHeapBufferReload(uint32 offset, bool isFirstLoad)
{
    enum ShouldReload
    {
        DoReload,
        DontReload
    };
    const auto AddLoadField = [&](AsmJsRegSlots::ConstSlots dst, AsmJsRegSlots::ConstSlots src, int32 fieldOffset, IRType type, ShouldReload shouldReload)
    {
        if (isFirstLoad || shouldReload == DoReload)
        {
            IR::RegOpnd * dstOpnd = BuildDstOpnd(dst, type);
            IR::Opnd * srcOpnd = IR::IndirOpnd::New(BuildSrcOpnd(src, type), fieldOffset, type, m_func);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            AddInstr(instr, offset);
        }
    };

#ifdef ENABLE_WASM
    const bool isWasm = m_func->GetJITFunctionBody()->IsWasmFunction();
    const bool isSharedMem = m_func->GetJITFunctionBody()->GetAsmJsInfo()->IsSharedMemory();

    if(isWasm)
    {
        // WebAssembly.Memory only needs to be loaded once as it can't change over the course of the function
        AddLoadField(AsmJsRegSlots::WasmMemoryReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::WebAssemblyModule::GetMemoryOffset(), TyVar, DontReload);

        if (!isSharedMem)
        {
            // ArrayBuffer
            // GrowMemory can change the ArrayBuffer, we have to reload it
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DoReload);

            // The buffer doesn't change when using Fast Virtual buffer even if we grow the memory
            ShouldReload shouldReloadBufferPointer = m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer() ? DontReload : DoReload;

            // ArrayBuffer.bufferContent
            AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DoReload);

            // RefCountedBuffer.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, shouldReloadBufferPointer);
            // ArrayBuffer.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DoReload);
        }
        else
        {
            // SharedArrayBuffer
            // SharedArrayBuffer cannot be detached and the buffer cannot change, no need to reload
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DontReload);
            // SharedArrayBuffer.SharedContents
            AddLoadField(AsmJsRegSlots::SharedContents, AsmJsRegSlots::ArrayReg, Js::SharedArrayBuffer::GetSharedContentsOffset(), TyVar, DontReload);
            // SharedContents.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferOffset(), TyVar, DontReload);
            // SharedContents.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferLengthOffset(), TyUint32, DoReload);
        }
    }
    else
#endif
    {
        // ArrayBuffer
        // The ArrayBuffer can be changed on the environment, if it is detached, we'll throw
        AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::AsmJsModuleMemory::MemoryTableBeginOffset, TyVar, DontReload);
        // ArrayBuffer.bufferContent
        AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DontReload);
        // RefCountedBuffer.buffer
        AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, DontReload);
        // ArrayBuffer.length
        AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DontReload);
    }
}